

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O2

int Internal_CompareAreaEstimate(ON_OutlineFigure **lhs,ON_OutlineFigure **rhs)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = ON_OutlineFigure::AreaEstimate(*lhs);
  dVar3 = ON_OutlineFigure::AreaEstimate(*rhs);
  uVar1 = 0xffffffff;
  if (ABS(dVar2) <= ABS(dVar3)) {
    uVar1 = (uint)(ABS(dVar2) < ABS(dVar3));
  }
  return uVar1;
}

Assistant:

static int Internal_CompareAreaEstimate(ON_OutlineFigure* const* lhs, ON_OutlineFigure* const* rhs)
{
  // Used to sort the figures_sorted_by_size[] array which is constructed in a way
  // that we know all elements are not nullptr and have valid AreaEstimates().
  const double lhs_area = fabs((*lhs)->AreaEstimate());
  const double rhs_area = fabs((*rhs)->AreaEstimate());
  if (lhs_area > rhs_area)
    return -1; // largest areas are before smaller areas
  if (lhs_area < rhs_area)
    return 1; // largest areas are before smaller areas
  return 0;
}